

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreAddDestinationFilterToEndpoint
               (HelicsCore core,char *filter,char *endpoint,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  size_t sVar3;
  size_t sVar4;
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    if (filter != (char *)0x0 && endpoint != (char *)0x0) {
      sVar3 = strlen(filter);
      sVar4 = strlen(endpoint);
      (*peVar1->_vptr_Core[0x49])(peVar1,sVar3,filter,sVar4,endpoint,peVar1->_vptr_Core[0x49]);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "Data link arguments cannot be null";
    }
  }
  return;
}

Assistant:

void helicsCoreAddDestinationFilterToEndpoint(HelicsCore core, const char* filter, const char* endpoint, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if ((filter == nullptr) || (endpoint == nullptr)) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidDataLinkString);
        return;
    }
    cppcore->addDestinationFilterToEndpoint(filter, endpoint);
}